

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_line.hpp
# Opt level: O0

StringList * __thiscall Args::CmdLine::values(CmdLine *this,String *name)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  int iVar1;
  undefined4 extraout_var;
  CmdLine *in_RDI;
  string *this_00;
  ArgIface *arg;
  Command *in_stack_ffffffffffffff28;
  allocator_type *in_stack_ffffffffffffff58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff60;
  string *psVar2;
  iterator in_stack_ffffffffffffff68;
  undefined1 *puVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  CmdLine *__s;
  undefined1 local_65 [13];
  string *local_58;
  string local_50 [32];
  string *local_30;
  undefined8 local_28;
  ArgIface *local_20;
  
  __s = in_RDI;
  local_20 = findArgument(in_RDI,(String *)
                                 CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  if (local_20 == (ArgIface *)0x0) {
    memset(__s,0,0x18);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x14439e);
  }
  else {
    iVar1 = (*local_20->_vptr_ArgIface[2])();
    if (iVar1 == 0) {
      Command::values_abi_cxx11_(in_stack_ffffffffffffff28);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT44(iVar1,in_stack_ffffffffffffff80),in_stack_ffffffffffffff78);
    }
    else if (iVar1 == 1) {
      local_58 = local_50;
      iVar1 = (*local_20->_vptr_ArgIface[0x13])();
      std::__cxx11::string::string(local_50,(string *)CONCAT44(extraout_var,iVar1));
      local_30 = local_50;
      local_28 = 1;
      puVar3 = local_65;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x14422b);
      __l._M_len = (size_type)puVar3;
      __l._M_array = in_stack_ffffffffffffff68;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(in_stack_ffffffffffffff60,__l,in_stack_ffffffffffffff58);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x144256);
      psVar2 = local_50;
      this_00 = (string *)&local_30;
      do {
        this_00 = this_00 + -0x20;
        std::__cxx11::string::~string(this_00);
      } while (this_00 != psVar2);
    }
    else if (iVar1 == 2) {
      (*local_20->_vptr_ArgIface[0x17])();
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT44(iVar1,in_stack_ffffffffffffff80),in_stack_ffffffffffffff78);
    }
    else {
      memset(__s,0,0x18);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x144381);
    }
  }
  return (StringList *)in_RDI;
}

Assistant:

StringList values(
		//! Name of the argument. Should be full name, i.e '-a' or '--arg'
		//! or 'add' if it's a command or subcommand.
		const String & name ) const
	{
		const auto * arg = findArgument( name );

		if( arg )
		{
			switch( arg->type() )
			{
				case ArgType::Command :
					return ( static_cast< const Command* > ( arg )->values() );

				case ArgType::Arg :
					return StringList(
						{ ( static_cast< const Arg* > ( arg )->value() ) } );

				case ArgType::MultiArg :
					return ( static_cast< const MultiArg* > ( arg )->values() );

				default :
					return StringList();
			}
		}
		else
			return StringList();
	}